

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_softsynth_mididevice.cpp
# Opt level: O3

bool __thiscall
SoftSynthMIDIDevice::ServiceStream(SoftSynthMIDIDevice *this,void *buff,int numbytes)

{
  MIDIHDR *pMVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  byte bVar6;
  double dVar7;
  
  uVar5 = numbytes >> 3;
  memset(buff,0,(long)numbytes);
  FCriticalSection::Enter(&this->CritSec);
  bVar6 = 1;
  if ((int)uVar5 < 1 || this->Events == (MIDIHDR *)0x0) {
LAB_0034182c:
    pMVar1 = this->Events;
    FCriticalSection::Leave(&this->CritSec);
    return (bool)(pMVar1 != (MIDIHDR *)0x0 & bVar6);
  }
  dVar7 = this->NextTickIn;
  do {
    uVar3 = (uint)dVar7;
    uVar2 = uVar3;
    if ((int)uVar5 < (int)uVar3) {
      uVar2 = uVar5;
    }
    if (0 < (int)uVar3) {
      (*(this->super_MIDIDevice)._vptr_MIDIDevice[0x1d])(this,buff,(ulong)uVar2);
      if (dVar7 != this->NextTickIn) {
        __assert_fail("NextTickIn == ticky",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/sound/music_softsynth_mididevice.cpp"
                      ,0x198,"virtual bool SoftSynthMIDIDevice::ServiceStream(void *, int)");
      }
      dVar7 = this->NextTickIn - (double)(int)uVar2;
      this->NextTickIn = dVar7;
      if (dVar7 < 0.0) {
        __assert_fail("NextTickIn >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/sound/music_softsynth_mididevice.cpp"
                      ,0x19a,"virtual bool SoftSynthMIDIDevice::ServiceStream(void *, int)");
      }
      uVar5 = uVar5 - uVar2;
      buff = (void *)((long)buff + (ulong)(uVar2 * 2) * 4);
    }
    if (dVar7 < 1.0) {
      iVar4 = PlayTick(this);
      if (iVar4 < 0) {
        __assert_fail("next >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/sound/music_softsynth_mididevice.cpp"
                      ,0x1a2,"virtual bool SoftSynthMIDIDevice::ServiceStream(void *, int)");
      }
      if (iVar4 == 0) {
        if (0 < (int)uVar5) {
          (*(this->super_MIDIDevice)._vptr_MIDIDevice[0x1d])(this,buff,(ulong)uVar5);
        }
        bVar6 = 0;
        goto LAB_0034182c;
      }
      dVar7 = (double)iVar4 * this->SamplesPerTick + this->NextTickIn;
      this->NextTickIn = dVar7;
      if (dVar7 < 0.0) {
        __assert_fail("NextTickIn >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/sound/music_softsynth_mididevice.cpp"
                      ,0x1af,"virtual bool SoftSynthMIDIDevice::ServiceStream(void *, int)");
      }
    }
    if ((this->Events == (MIDIHDR *)0x0) || ((int)uVar5 < 1)) goto LAB_0034182c;
  } while( true );
}

Assistant:

bool SoftSynthMIDIDevice::ServiceStream (void *buff, int numbytes)
{
	float *samples = (float *)buff;
	float *samples1;
	int numsamples = numbytes / sizeof(float) / 2;
	bool prev_ended = false;
	bool res = true;

	samples1 = samples;
	memset(buff, 0, numbytes);

	CritSec.Enter();
	while (Events != NULL && numsamples > 0)
	{
		double ticky = NextTickIn;
		int tick_in = int(NextTickIn);
		int samplesleft = MIN(numsamples, tick_in);

		if (samplesleft > 0)
		{
			ComputeOutput(samples1, samplesleft);
			assert(NextTickIn == ticky);
			NextTickIn -= samplesleft;
			assert(NextTickIn >= 0);
			numsamples -= samplesleft;
			samples1 += samplesleft * 2;
		}
		
		if (NextTickIn < 1)
		{
			int next = PlayTick();
			assert(next >= 0);
			if (next == 0)
			{ // end of song
				if (numsamples > 0)
				{
					ComputeOutput(samples1, numsamples);
				}
				res = false;
				break;
			}
			else
			{
				NextTickIn += SamplesPerTick * next;
				assert(NextTickIn >= 0);
			}
		}
	}

	if (Events == NULL)
	{
		res = false;
	}
	CritSec.Leave();
	return res;
}